

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  ostream *poVar2;
  allocator local_1f9;
  string local_1f8 [32];
  undefined1 local_1d8 [8];
  model ftrl2;
  string local_160 [39];
  allocator local_139;
  string local_138 [32];
  undefined1 local_118 [8];
  model ftrl;
  dataset xtest;
  allocator local_31;
  string local_30 [8];
  string test;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,"0 3:1 6:1 17:1 27:1 35:1 40:1 57:1 63:1 69:1 73:1 74:1 76:1 81:1 103:1",
             &local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  dataset::dataset((dataset *)
                   &ftrl.n.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(string *)local_30);
  model::model((model *)local_118,0x7b,10.0,0.0,0.0,1.0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,anon_var_dwarf_ca60,&local_139);
  model::fit((model *)local_118,(string *)local_138);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_160,anon_var_dwarf_ca76,
             (allocator *)
             ((long)&ftrl2.n.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  model::save_model((model *)local_118,(string *)local_160);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ftrl2.n.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,anon_var_dwarf_ca76,&local_1f9);
  model::model((model *)local_1d8,(string *)local_1f8);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  iVar1 = model::predict((model *)local_118,
                         (dataset *)
                         &ftrl.n.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0.5);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  iVar1 = model::predict((model *)local_1d8,
                         (dataset *)
                         &ftrl.n.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0.5);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  model::~model((model *)local_1d8);
  model::~model((model *)local_118);
  dataset::~dataset((dataset *)
                    &ftrl.n.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int main() {
    string test = "0 3:1 6:1 17:1 27:1 35:1 40:1 57:1 63:1 69:1 73:1 74:1 76:1 81:1 103:1";
    dataset xtest(test);
    model ftrl(123, 10, 0, 0, 1);
    ftrl.fit("/Users/clytie/Documents/研究生/C++/algorithm/FTRL/data/Traindata.ftrl");
    ftrl.save_model("/Users/clytie/Documents/研究生/C++/algorithm/FTRL/data/model.ftrl");
    model ftrl2("/Users/clytie/Documents/研究生/C++/algorithm/FTRL/data/model.ftrl");
    cout << ftrl.predict(&xtest) << endl;
    cout << ftrl2.predict(&xtest) << endl;
    return 0;
}